

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cbor_tests.cpp
# Opt level: O0

void check_encode_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *expected,json *j)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  unsigned_long *rhs;
  unsigned_long *puVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ExprLhs<const_unsigned_long_&> EVar3;
  AssertionHandler *pAVar4;
  ExprLhs<const_unsigned_long_&> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  AssertionHandler catchAssertionHandler_1;
  size_t i;
  AssertionHandler catchAssertionHandler;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  undefined4 in_stack_fffffffffffffdd8;
  Flags in_stack_fffffffffffffddc;
  ExprLhs<const_unsigned_char_&> in_stack_fffffffffffffde0;
  StringRef *in_stack_fffffffffffffde8;
  SourceLineInfo *this;
  AssertionHandler *in_stack_fffffffffffffdf0;
  AssertionHandler *this_00;
  char *in_stack_fffffffffffffdf8;
  SourceLineInfo *this_01;
  ExprLhs<const_unsigned_long_&> *this_02;
  SourceLineInfo local_190;
  StringRef local_180;
  AssertionHandler *local_128;
  cbor_encode_options *in_stack_fffffffffffffee0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  ExprLhs<const_unsigned_long_&> *local_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e02b4);
  jsoncons::cbor::cbor_encode_options::cbor_encode_options
            ((cbor_encode_options *)in_stack_fffffffffffffde0.m_lhs);
  jsoncons::cbor::
  encode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  jsoncons::cbor::cbor_encode_options::~cbor_encode_options
            ((cbor_encode_options *)in_stack_fffffffffffffde0.m_lhs);
  rhs = (unsigned_long *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28)
  ;
  puVar1 = (unsigned_long *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
  this_02 = local_10;
  if (rhs != puVar1) {
    pbVar2 = jsoncons::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::operator<<(pbVar2,"\n");
    this_02 = local_10;
  }
  operator____catch_sr
            ((char *)in_stack_fffffffffffffde0.m_lhs,
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  this_01 = (SourceLineInfo *)&stack0xffffffffffffff40;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/encode_cbor_tests.cpp"
             ,0x1b);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  capturedExpression.m_size = (size_type)this_01;
  capturedExpression.m_start = in_stack_fffffffffffffdf8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (SourceLineInfo *)in_stack_fffffffffffffde0.m_lhs,capturedExpression,
             in_stack_fffffffffffffddc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
  EVar3 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (unsigned_long *)0x3e0445);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
  Catch::ExprLhs<unsigned_long_const&>::operator==(this_02,rhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffffde0.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x3e04b1);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffde0.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffde0.m_lhs);
  local_128 = (AssertionHandler *)0x0;
  while( true ) {
    this_00 = local_128;
    pAVar4 = (AssertionHandler *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
    if (pAVar4 <= this_00) break;
    local_180 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffde0.m_lhs,
                           CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    this = &local_190;
    Catch::SourceLineInfo::SourceLineInfo
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/encode_cbor_tests.cpp"
               ,0x1e);
    Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
    capturedExpression_00.m_size = (size_type)this_01;
    capturedExpression_00.m_start = (char *)EVar3.m_lhs;
    Catch::AssertionHandler::AssertionHandler
              (this_00,(StringRef *)this,(SourceLineInfo *)in_stack_fffffffffffffde0.m_lhs,
               capturedExpression_00,in_stack_fffffffffffffddc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (&local_28,(size_type)local_128);
    in_stack_fffffffffffffde0 =
         Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                    (uchar *)0x3e060d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (local_8,(size_type)local_128);
    Catch::ExprLhs<unsigned_char_const&>::operator==
              ((ExprLhs<const_unsigned_char_&> *)this_02,(uchar *)rhs);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)in_stack_fffffffffffffde0.m_lhs,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
              );
    Catch::BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&>::~BinaryExpr
              ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)0x3e0665);
    Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffde0.m_lhs);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffde0.m_lhs);
    local_128 = (AssertionHandler *)
                ((long)&(((_Vector_impl *)&(local_128->m_assertionInfo).macroName)->
                        super__Vector_impl_data)._M_start + 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return;
}

Assistant:

void check_encode_cbor(const std::vector<uint8_t>& expected, const json& j)
{
    std::vector<uint8_t> result;
    cbor::encode_cbor(j,result);

    if (result.size() != expected.size())
    {
        std::cout << j << "\n";
    }
    REQUIRE(result.size() == expected.size());
    for (std::size_t i = 0; i < expected.size(); ++i)
    {
        REQUIRE(result[i] == expected[i]);
    }
}